

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode LocalizedText_encodeBinary(UA_LocalizedText *src,UA_DataType *_)

{
  UA_Byte *pUVar1;
  UA_Byte *pUVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  
  pUVar1 = (src->locale).data;
  pUVar2 = (src->text).data;
  UVar4 = 0x80080000;
  if (pos + 1 <= end) {
    _ = (UA_DataType *)(ulong)((pUVar1 != (UA_Byte *)0x0) + 2);
    if (pUVar2 == (UA_Byte *)0x0) {
      _ = (UA_DataType *)(ulong)(pUVar1 != (UA_Byte *)0x0);
    }
    *pos = (UA_Byte)_;
    pos = pos + 1;
    UVar4 = 0;
  }
  if (pUVar1 != (UA_Byte *)0x0) {
    UVar3 = String_encodeBinary(&src->locale,_);
    UVar4 = UVar4 | UVar3;
  }
  if (pUVar2 != (UA_Byte *)0x0) {
    UVar3 = String_encodeBinary(&src->text,_);
    UVar4 = UVar4 | UVar3;
  }
  return UVar4;
}

Assistant:

static UA_StatusCode
LocalizedText_encodeBinary(UA_LocalizedText const *src, const UA_DataType *_) {
    /* Set up the encoding mask */
    UA_Byte encoding = 0;
    if(src->locale.data)
        encoding |= UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_LOCALE;
    if(src->text.data)
        encoding |= UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_TEXT;

    /* Encode the content */
    UA_StatusCode retval = Byte_encodeBinary(&encoding, NULL);
    if(encoding & UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_LOCALE)
        retval |= String_encodeBinary(&src->locale, NULL);
    if(encoding & UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_TEXT)
        retval |= String_encodeBinary(&src->text, NULL);
    return retval;
}